

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaVPushText(xmlSchemaValidCtxtPtr vctxt,int nodeType,xmlChar *value,int len,int mode,
                      int *consumed)

{
  int *piVar1;
  xmlSchemaContentType xVar2;
  byte bVar3;
  xmlSchemaNodeInfoPtr pxVar4;
  xmlChar *pxVar5;
  ulong uVar6;
  uint uVar7;
  xmlParserErrors error;
  int iVar8;
  long lVar9;
  char *message;
  
  pxVar4 = vctxt->inode;
  uVar7 = pxVar4->flags;
  if ((uVar7 & 4) == 0) {
    xVar2 = pxVar4->typeDef->contentType;
    if (xVar2 == XML_SCHEMA_CONTENT_ELEMENTS) {
      if (nodeType == 3) {
        if (value == (xmlChar *)0x0) {
          return 0;
        }
        if (len < 0) {
          for (; uVar6 = (ulong)*value, uVar6 < 0x21; value = value + 1) {
            if ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0) {
              if (uVar6 == 0) {
                return 0;
              }
              break;
            }
          }
        }
        else {
          bVar3 = *value;
          if (len == 0 || bVar3 == 0) {
            return 0;
          }
          lVar9 = 1;
          while ((bVar3 < 0x21 && ((0x100002600U >> ((ulong)bVar3 & 0x3f) & 1) != 0))) {
            bVar3 = value[lVar9];
            if (bVar3 == 0) {
              return 0;
            }
            iVar8 = (int)lVar9;
            lVar9 = lVar9 + 1;
            if (len == iVar8) {
              return 0;
            }
          }
        }
      }
      message = 
      "Character content other than whitespace is not allowed because the content type is \'element-only\'"
      ;
      error = XML_SCHEMAV_CVC_COMPLEX_TYPE_2_3;
    }
    else {
      if (xVar2 != XML_SCHEMA_CONTENT_EMPTY) {
        if (value == (xmlChar *)0x0) {
          return 0;
        }
        if (*value == '\0') {
          return 0;
        }
        if (xVar2 == XML_SCHEMA_CONTENT_MIXED) {
          if (pxVar4->decl == (xmlSchemaElementPtr)0x0) {
            return 0;
          }
          if (pxVar4->decl->value == (xmlChar *)0x0) {
            return 0;
          }
        }
        if (pxVar4->value == (xmlChar *)0x0) {
          if (mode != 3) {
            if (mode == 2) {
              pxVar4->value = value;
              uVar7 = uVar7 | 2;
            }
            else {
              pxVar4->value = value;
              uVar7 = uVar7 & 0xfffffff9;
            }
            pxVar4->flags = uVar7;
            return 0;
          }
          if (len == -1) {
            pxVar5 = xmlStrdup(value);
          }
          else {
            pxVar5 = xmlStrndup(value,len);
          }
        }
        else {
          if (len < 0) {
            len = xmlStrlen(value);
            pxVar4 = vctxt->inode;
            uVar7 = pxVar4->flags;
          }
          if ((uVar7 & 2) != 0) {
            pxVar5 = xmlStrncat(pxVar4->value,value,len);
            vctxt->inode->value = pxVar5;
            return 0;
          }
          pxVar5 = xmlStrncatNew(pxVar4->value,value,len);
        }
        pxVar4 = vctxt->inode;
        pxVar4->value = pxVar5;
        piVar1 = &pxVar4->flags;
        *(byte *)piVar1 = (byte)*piVar1 | 2;
        return 0;
      }
      message = "Character content is not allowed, because the content type is empty";
      error = XML_SCHEMAV_CVC_COMPLEX_TYPE_2_1;
    }
  }
  else {
    message = "Neither character nor element content is allowed because the element is \'nilled\'";
    error = XML_SCHEMAV_CVC_ELT_3_2_1;
  }
  xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,error,(xmlNodePtr)0x0,
                      (xmlSchemaBasicItemPtr)0x0,message,(xmlChar *)0x0,(xmlChar *)0x0,
                      (xmlChar *)0x0,(xmlChar *)0x0);
  return vctxt->err;
}

Assistant:

static int
xmlSchemaVPushText(xmlSchemaValidCtxtPtr vctxt,
		  int nodeType, const xmlChar *value, int len,
		  int mode, int *consumed)
{
    /*
    * Unfortunately we have to duplicate the text sometimes.
    * OPTIMIZE: Maybe we could skip it, if:
    *   1. content type is simple
    *   2. whitespace is "collapse"
    *   3. it consists of whitespace only
    *
    * Process character content.
    */
    if (consumed != NULL)
	*consumed = 0;
    if (INODE_NILLED(vctxt->inode)) {
	/*
	* SPEC cvc-elt (3.3.4 - 3.2.1)
	* "The element information item must have no character or
	* element information item [children]."
	*/
	VERROR(XML_SCHEMAV_CVC_ELT_3_2_1, NULL,
	    "Neither character nor element content is allowed "
	    "because the element is 'nilled'");
	return (vctxt->err);
    }
    /*
    * SPEC (2.1) "If the {content type} is empty, then the
    * element information item has no character or element
    * information item [children]."
    */
    if (vctxt->inode->typeDef->contentType ==
	    XML_SCHEMA_CONTENT_EMPTY) {
	VERROR(XML_SCHEMAV_CVC_COMPLEX_TYPE_2_1, NULL,
	    "Character content is not allowed, "
	    "because the content type is empty");
	return (vctxt->err);
    }

    if (vctxt->inode->typeDef->contentType ==
	    XML_SCHEMA_CONTENT_ELEMENTS) {
	if ((nodeType != XML_TEXT_NODE) ||
	    (! xmlSchemaIsBlank((xmlChar *) value, len))) {
	    /*
	    * SPEC cvc-complex-type (2.3)
	    * "If the {content type} is element-only, then the
	    * element information item has no character information
	    * item [children] other than those whose [character
	    * code] is defined as a white space in [XML 1.0 (Second
	    * Edition)]."
	    */
	    VERROR(XML_SCHEMAV_CVC_COMPLEX_TYPE_2_3, NULL,
		"Character content other than whitespace is not allowed "
		"because the content type is 'element-only'");
	    return (vctxt->err);
	}
	return (0);
    }

    if ((value == NULL) || (value[0] == 0))
	return (0);
    /*
    * Save the value.
    * NOTE that even if the content type is *mixed*, we need the
    * *initial value* for default/fixed value constraints.
    */
    if ((vctxt->inode->typeDef->contentType == XML_SCHEMA_CONTENT_MIXED) &&
	((vctxt->inode->decl == NULL) ||
	(vctxt->inode->decl->value == NULL)))
	return (0);

    if (vctxt->inode->value == NULL) {
	/*
	* Set the value.
	*/
	switch (mode) {
	    case XML_SCHEMA_PUSH_TEXT_PERSIST:
		/*
		* When working on a tree.
		*/
		vctxt->inode->value = value;
		vctxt->inode->flags &=
		    ~XML_SCHEMA_NODE_INFO_FLAG_OWNED_VALUES;
		break;
	    case XML_SCHEMA_PUSH_TEXT_CREATED:
		/*
		* When working with the reader.
		* The value will be freed by the element info.
		*/
		vctxt->inode->value = value;
		if (consumed != NULL)
		    *consumed = 1;
		vctxt->inode->flags |=
		    XML_SCHEMA_NODE_INFO_FLAG_OWNED_VALUES;
		break;
	    case XML_SCHEMA_PUSH_TEXT_VOLATILE:
		/*
		* When working with SAX.
		* The value will be freed by the element info.
		*/
		if (len != -1)
		    vctxt->inode->value = BAD_CAST xmlStrndup(value, len);
		else
		    vctxt->inode->value = BAD_CAST xmlStrdup(value);
		vctxt->inode->flags |=
		    XML_SCHEMA_NODE_INFO_FLAG_OWNED_VALUES;
		break;
	    default:
		break;
	}
    } else {
	if (len < 0)
	    len = xmlStrlen(value);
	/*
	* Concat the value.
	*/
	if (vctxt->inode->flags & XML_SCHEMA_NODE_INFO_FLAG_OWNED_VALUES) {
	    vctxt->inode->value = BAD_CAST xmlStrncat(
		(xmlChar *) vctxt->inode->value, value, len);
	} else {
	    vctxt->inode->value =
		BAD_CAST xmlStrncatNew(vctxt->inode->value, value, len);
	    vctxt->inode->flags |= XML_SCHEMA_NODE_INFO_FLAG_OWNED_VALUES;
	}
    }

    return (0);
}